

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O0

int __thiscall EmulNet::ENcleanup(EmulNet *this)

{
  FILE *__stream;
  int iVar1;
  FILE *file;
  int recv_total;
  int sent_total;
  int j;
  int i;
  EmulNet *this_local;
  
  (this->emulnet).nextid = 0;
  __stream = fopen("msgcount.log","w+");
  while (0 < (this->emulnet).currbuffsize) {
    iVar1 = (this->emulnet).currbuffsize + -1;
    (this->emulnet).currbuffsize = iVar1;
    free((this->emulnet).buff[iVar1]);
  }
  for (sent_total = 1; sent_total <= this->par->EN_GPSZ; sent_total = sent_total + 1) {
    fprintf(__stream,"node %3d ",(ulong)(uint)sent_total);
    file._4_4_ = 0;
    file._0_4_ = 0;
    for (recv_total = 0; iVar1 = Params::getcurrtime(this->par), recv_total < iVar1;
        recv_total = recv_total + 1) {
      file._4_4_ = this->sent_msgs[sent_total][recv_total] + file._4_4_;
      file._0_4_ = this->recv_msgs[sent_total][recv_total] + (uint)file;
      if (sent_total == 0x43) {
        fprintf(__stream,"special %4d %4d %4d\n",(ulong)(uint)recv_total,
                (ulong)(uint)this->sent_msgs[0x43][recv_total],
                (ulong)(uint)this->recv_msgs[0x43][recv_total]);
      }
      else {
        fprintf(__stream," (%4d, %4d)",(ulong)(uint)this->sent_msgs[sent_total][recv_total],
                (ulong)(uint)this->recv_msgs[sent_total][recv_total]);
        if (recv_total % 10 == 9) {
          fprintf(__stream,"\n         ");
        }
      }
    }
    fprintf(__stream,"\n");
    fprintf(__stream,"node %3d sent_total %6u  recv_total %6u\n\n",(ulong)(uint)sent_total,
            (ulong)file._4_4_,(ulong)(uint)file);
  }
  fclose(__stream);
  return 0;
}

Assistant:

int EmulNet::ENcleanup() {
	emulnet.nextid=0;
	int i, j;
	int sent_total, recv_total;

	FILE* file = fopen("msgcount.log", "w+");

	while(emulnet.currbuffsize > 0) {
		free(emulnet.buff[--emulnet.currbuffsize]);
	}

	for ( i = 1; i <= par->EN_GPSZ; i++ ) {
		fprintf(file, "node %3d ", i);
		sent_total = 0;
		recv_total = 0;

		for (j = 0; j < par->getcurrtime(); j++) {

			sent_total += sent_msgs[i][j];
			recv_total += recv_msgs[i][j];
			if (i != 67) {
				fprintf(file, " (%4d, %4d)", sent_msgs[i][j], recv_msgs[i][j]);
				if (j % 10 == 9) {
					fprintf(file, "\n         ");
				}
			}
			else {
				fprintf(file, "special %4d %4d %4d\n", j, sent_msgs[i][j], recv_msgs[i][j]);
			}
		}
		fprintf(file, "\n");
		fprintf(file, "node %3d sent_total %6u  recv_total %6u\n\n", i, sent_total, recv_total);
	}

	fclose(file);
	return 0;
}